

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O0

void store_mf(int fd,memfile *mf)

{
  int iVar1;
  ssize_t sVar2;
  int local_20;
  int ret;
  int left;
  int len;
  memfile *mf_local;
  int fd_local;
  
  iVar1 = mf->pos;
  for (local_20 = iVar1; local_20 != 0; local_20 = local_20 - (int)sVar2) {
    sVar2 = write(fd,mf->buf + (iVar1 - local_20),(long)local_20);
    if ((int)sVar2 == -1) break;
  }
  mfree(mf);
  mnew(mf,(memfile *)0x0);
  return;
}

Assistant:

void store_mf(int fd, struct memfile *mf)
{
	int len, left, ret;
	
	len = left = mf->pos;
	while (left) {
	    ret = write(fd, &mf->buf[len - left], left);
	    if (ret == -1) /* error */
		goto out;
	    left -= ret;
	}

out:
	mfree(mf);
	mnew(mf, NULL);
}